

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void md5_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  md5 *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  s = (md5 *)len;
  len_local = (size_t)vp;
  vp_local = bs;
  while (s != (md5 *)0x0) {
    _Var1 = md5_block_write((md5_block *)&bs[-4].binarysink_,(void **)&len_local,(size_t *)&s);
    if (_Var1) {
      md5_do_block((uint32_t *)(bs + -4),(uint8_t *)&bs[-4].binarysink_);
    }
  }
  return;
}

Assistant:

static void md5_write(BinarySink *bs, const void *vp, size_t len)
{
    md5 *s = BinarySink_DOWNCAST(bs, md5);

    while (len > 0)
        if (md5_block_write(&s->blk, &vp, &len))
            md5_do_block(s->core, s->blk.block);
}